

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unsubtyping.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_22::Unsubtyping::run(Unsubtyping *this,Module *wasm)

{
  UniqueDeferredQueue<wasm::HeapType> *this_00;
  bool bVar1;
  HeapTypeKind HVar2;
  mapped_type *pmVar3;
  Struct *pSVar4;
  Struct *pSVar5;
  iterator iVar6;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> _Var7;
  HeapType HVar8;
  HeapType HVar9;
  long *plVar10;
  long lVar11;
  long lVar12;
  __node_type *p_Var13;
  optional<wasm::HeapType> oVar14;
  Signature SVar15;
  Signature SVar16;
  undefined **local_1e8;
  HeapType src;
  HeapType local_50;
  mapped_type super;
  HeapType type;
  
  if (((wasm->features).features & 0x400) == 0) {
    return;
  }
  wasm::ModuleUtils::getPublicHeapTypes
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&stack0xfffffffffffffe18,
             wasm);
  for (HVar8.id = (uintptr_t)local_1e8; HVar8.id != src.id; HVar8.id = HVar8.id + 8) {
    super.id = ((pointer)HVar8.id)->id;
    oVar14 = HeapType::getDeclaredSuperType(&super);
    if (((undefined1  [16])
         oVar14.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      noteSubtype(this,(HeapType)super.id,
                  oVar14.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value);
    }
  }
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
            ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             &stack0xfffffffffffffe18);
  Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
  ::walkModule((Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
                *)&(this->
                   super_WalkerPass<wasm::ControlFlowWalker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>_>
                   ).
                   super_ControlFlowWalker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
               ,wasm);
  this_00 = &this->work;
LAB_00bf212b:
  bVar1 = UniqueDeferredQueue<wasm::HeapType>::empty(this_00);
  if (bVar1) {
    GlobalTypeRewriter::GlobalTypeRewriter((GlobalTypeRewriter *)&stack0xfffffffffffffe18,wasm);
    local_1e8 = &PTR__GlobalTypeRewriter_011264c8;
    super.id = 0;
    GlobalTypeRewriter::update
              ((GlobalTypeRewriter *)&stack0xfffffffffffffe18,
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&super);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&super);
    GlobalTypeRewriter::~GlobalTypeRewriter((GlobalTypeRewriter *)&stack0xfffffffffffffe18);
    ReFinalize::ReFinalize((ReFinalize *)&stack0xfffffffffffffe18);
    WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
           *)&stack0xfffffffffffffe18,
          (this->
          super_WalkerPass<wasm::ControlFlowWalker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>_>
          ).super_Pass.runner,wasm);
    ReFinalize::~ReFinalize((ReFinalize *)&stack0xfffffffffffffe18);
    return;
  }
switchD_00bf2197_default:
  do {
    bVar1 = UniqueDeferredQueue<wasm::HeapType>::empty(this_00);
    p_Var13 = (__node_type *)&(this->supertypes)._M_h._M_before_begin;
    if (bVar1) break;
    super.id = (uintptr_t)UniqueDeferredQueue<wasm::HeapType>::pop(this_00);
    pmVar3 = std::__detail::
             _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)&this->supertypes,&super);
    local_50.id = pmVar3->id;
    if (0x7c < local_50.id) {
      HVar2 = HeapType::getKind(&super);
      switch(HVar2) {
      case Basic:
        handle_unreachable("unexpected kind",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Unsubtyping.cpp"
                           ,0x123);
      case Func:
        SVar15 = HeapType::getSignature(&super);
        HVar8.id = (uintptr_t)SVar15.results.id;
        SVar16 = HeapType::getSignature(&local_50);
        HVar9.id = (uintptr_t)SVar16.results.id;
        noteSubtype(this,SVar16.params.id,SVar15.params.id);
        break;
      case Struct:
        pSVar4 = HeapType::getStruct(&super);
        pSVar5 = HeapType::getStruct(&local_50);
        lVar11 = (long)(pSVar5->fields).
                       super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pSVar5->fields).
                       super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                       super__Vector_impl_data._M_start >> 4;
        lVar12 = 0;
        while (bVar1 = lVar11 != 0, lVar11 = lVar11 + -1, bVar1) {
          noteSubtype(this,(Type)*(uintptr_t *)
                                  ((long)&(((pSVar4->fields).
                                            super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->type).id +
                                  lVar12),
                      (Type)*(uintptr_t *)
                             ((long)&(((pSVar5->fields).
                                       super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->type).id + lVar12
                             ));
          lVar12 = lVar12 + 0x10;
        }
        goto switchD_00bf2197_default;
      case Array:
        HeapType::getArray((HeapType *)&stack0xfffffffffffffe18);
        HVar8.id = (uintptr_t)local_1e8;
        HeapType::getArray((HeapType *)&stack0xfffffffffffffe18);
        HVar9.id = (uintptr_t)local_1e8;
        break;
      case Cont:
        handle_unreachable("TODO: cont",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Unsubtyping.cpp"
                           ,0x121);
      default:
        goto switchD_00bf2197_default;
      }
      noteSubtype(this,(Type)HVar8.id,(Type)HVar9.id);
    }
  } while( true );
  while (p_Var13 = (__node_type *)(p_Var13->super__Hash_node_base)._M_nxt,
        p_Var13 != (__node_type *)0x0) {
    HVar8.id = *(uintptr_t *)
                &(p_Var13->
                 super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>).
                 super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::HeapType>_>.
                 _M_storage._M_storage.__align;
    for (_Var7._M_cur = p_Var13; _Var7._M_cur != (__node_type *)0x0;
        _Var7._M_cur = (__node_type *)
                       std::
                       _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(&(this->supertypes)._M_h,
                              (key_type *)
                              ((long)&((_Var7._M_cur)->
                                      super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                                      ).
                                      super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::HeapType>_>
                                      ._M_storage._M_storage + 8))) {
      local_1e8 = *(undefined ***)
                   ((long)&((_Var7._M_cur)->
                           super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::HeapType>_>
                           ._M_storage._M_storage + 8);
      iVar6 = std::
              _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->castTypes)._M_h,(key_type *)&stack0xfffffffffffffe18);
      if (iVar6.
          super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        plVar10 = (long *)((long)iVar6.
                                 super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_true>
                                 ._M_cur + 0x20);
        while (plVar10 = (long *)*plVar10, plVar10 != (long *)0x0) {
          HVar9.id = plVar10[1];
          bVar1 = HeapType::isSubType(HVar8,HVar9);
          if (bVar1) {
            noteSubtype(this,HVar8,HVar9);
          }
        }
      }
    }
  }
  goto LAB_00bf212b;
}

Assistant:

void run(Module* wasm) override {
    if (!wasm->features.hasGC()) {
      return;
    }
    analyzePublicTypes(*wasm);
    walkModule(wasm);
    analyzeTransitiveDependencies();
    optimizeTypes(*wasm);
    // Cast types may be refinable if their source and target types are no
    // longer related. TODO: Experiment with running this only after checking
    // whether it is necessary.
    ReFinalize().run(getPassRunner(), wasm);
  }